

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_afalg.c
# Opt level: O0

int afalg_cipher_cleanup(EVP_CIPHER_CTX *ctx)

{
  int *piVar1;
  EVP_CIPHER_CTX *in_RDI;
  afalg_ctx *actx;
  int local_4;
  
  if (in_RDI == (EVP_CIPHER_CTX *)0x0) {
    local_4 = 0;
  }
  else {
    piVar1 = (int *)EVP_CIPHER_CTX_get_cipher_data(in_RDI);
    if ((piVar1 == (int *)0x0) || (*piVar1 != 0x1890671)) {
      local_4 = 1;
    }
    else {
      close(piVar1[1]);
      close(piVar1[2]);
      if (piVar1[5] == 1) {
        close(piVar1[4]);
      }
      io_destroy(0x2e3dd1);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int afalg_cipher_cleanup(EVP_CIPHER_CTX *ctx)
{
    afalg_ctx *actx;

    if (ctx == NULL) {
        ALG_WARN("NULL parameter passed to function %s(%d)\n", __FILE__,
                 __LINE__);
        return 0;
    }

    actx = (afalg_ctx *) EVP_CIPHER_CTX_get_cipher_data(ctx);
    if (actx == NULL || actx->init_done != MAGIC_INIT_NUM)
        return 1;

    close(actx->sfd);
    close(actx->bfd);
# ifdef ALG_ZERO_COPY
    close(actx->zc_pipe[0]);
    close(actx->zc_pipe[1]);
# endif
    /* close efd in sync mode, async mode is closed in afalg_waitfd_cleanup() */
    if (actx->aio.mode == MODE_SYNC)
        close(actx->aio.efd);
    io_destroy(actx->aio.aio_ctx);

    return 1;
}